

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TDeletingArray
          (TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this)

{
  uint uVar1;
  FOptionMenuItem **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                        (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                        (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,(ulong)local_14);
    if (*ppFVar2 != (FOptionMenuItem *)0x0) {
      ppFVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,(ulong)local_14
                          );
      if (*ppFVar2 != (FOptionMenuItem *)0x0) {
        (*((*ppFVar2)->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
    }
  }
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TArray
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}